

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

void __thiscall HEVCStreamReader::HEVCStreamReader(HEVCStreamReader *this)

{
  HevcHdrUnit *this_00;
  HevcSliceHeader *this_01;
  HEVCStreamReader *this_local;
  
  MPEGStreamReader::MPEGStreamReader(&this->super_MPEGStreamReader);
  (this->super_MPEGStreamReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__HEVCStreamReader_00440cc0;
  this->m_vps = (HevcVpsUnit *)0x0;
  this->m_sps = (HevcSpsUnit *)0x0;
  this->m_pps = (HevcPpsUnit *)0x0;
  this_00 = (HevcHdrUnit *)operator_new(0x40);
  HevcHdrUnit::HevcHdrUnit(this_00);
  this->m_hdr = this_00;
  this_01 = (HevcSliceHeader *)operator_new(0x48);
  HevcSliceHeader::HevcSliceHeader(this_01);
  this->m_slice = this_01;
  this->m_firstFrame = true;
  this->m_frameNum = 0;
  this->m_fullPicOrder = 0;
  this->m_picOrderBase = 0;
  this->m_frameDepth = 1;
  this->m_picOrderMsb = 0;
  this->m_prevPicOrder = 0;
  this->m_lastIFrame = false;
  MemoryBlock::MemoryBlock(&this->m_vpsBuffer);
  MemoryBlock::MemoryBlock(&this->m_spsBuffer);
  MemoryBlock::MemoryBlock(&this->m_ppsBuffer);
  this->m_firstFileFrame = false;
  this->m_vpsCounter = 0;
  this->m_vpsSizeDiff = 0;
  return;
}

Assistant:

HEVCStreamReader::HEVCStreamReader()
    : m_vps(nullptr),
      m_sps(nullptr),
      m_pps(nullptr),
      m_hdr(new HevcHdrUnit()),
      m_slice(new HevcSliceHeader()),
      m_firstFrame(true),
      m_frameNum(0),
      m_fullPicOrder(0),
      m_picOrderBase(0),
      m_frameDepth(1),

      m_picOrderMsb(0),
      m_prevPicOrder(0),
      m_lastIFrame(false),
      m_firstFileFrame(false),
      m_vpsCounter(0),
      m_vpsSizeDiff(0)
{
}